

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

void do_cmd_steal_aux(wchar_t dir)

{
  _Bool _Var1;
  square_conflict *psVar2;
  monster *mon;
  loc_conflict local_14;
  loc_conflict grid;
  wchar_t dir_local;
  
  grid.x = dir;
  local_14 = (loc_conflict)loc_sum(player->grid,ddgrid[dir]);
  player->upkeep->energy_use = (uint)z_info->move_energy;
  _Var1 = player_confuse_dir(player,&grid.x,false);
  if (_Var1) {
    local_14 = (loc_conflict)loc_sum(player->grid,ddgrid[grid.x]);
  }
  psVar2 = square((chunk *)cave,local_14);
  if ((psVar2->mon < 1) ||
     (_Var1 = flag_has_dbg((player->state).pflags,3,0xe,"player->state.pflags","(PF_STEAL)"), !_Var1
     )) {
    msg("You spin around.");
  }
  else {
    mon = square_monster((chunk *)cave,local_14);
    steal_monster_item(mon,L'\xffffffff');
  }
  return;
}

Assistant:

static void do_cmd_steal_aux(int dir)
{
	/* Get location */
	struct loc grid = loc_sum(player->grid, ddgrid[dir]);

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Apply confusion */
	if (player_confuse_dir(player, &dir, false)) {
		/* Get location */
		grid = loc_sum(player->grid, ddgrid[dir]);
	}

	/* Attack or steal from monsters */
	if ((square(cave, grid)->mon > 0) && player_has(player, PF_STEAL)) {
		steal_monster_item(square_monster(cave, grid), -1);
	} else {
		/* Oops */
		msg("You spin around.");
	}
}